

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.cpp
# Opt level: O3

Value * __thiscall ccd::Json::Value::operator[](Value *this,string *key)

{
  variant_alternative_t<4UL,_variant<int,_double,_bool,_basic_string<char>,_map<basic_string<char>,_Value,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_Value>_>_>,_vector<Value,_allocator<Value>_>_>_>
  *this_00;
  mapped_type *pmVar1;
  string *psVar2;
  
  if (this->m_type != Object) {
    if (this->m_type != Null) {
      psVar2 = (string *)__cxa_allocate_exception(0x20);
      *(string **)psVar2 = psVar2 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>(psVar2,"Item is no Object","");
      __cxa_throw(psVar2,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    }
    this->m_type = Object;
  }
  this_00 = std::
            get<4ul,int,double,bool,std::__cxx11::string,std::map<std::__cxx11::string,ccd::Json::Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ccd::Json::Value>>>,std::vector<ccd::Json::Value,std::allocator<ccd::Json::Value>>>
                      (&this->m_value);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccd::Json::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccd::Json::Value>_>_>
           ::operator[](this_00,key);
  return pmVar1;
}

Assistant:

Value& Value::operator[] ( const std::string& key )
{
	if ( m_type == Type::Null ) {
		m_type = Type::Object;
	}

	if ( m_type != Type::Object )
		throw std::string ( "Item is no Object" );


	return std::get<Object>(m_value)[key];
}